

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.hxx
# Opt level: O0

void __thiscall rosgraph_msgs::Log_<std::allocator<void>_>::Log_(Log_<std::allocator<void>_> *this)

{
  long in_RDI;
  Header_<std::allocator<void>_> *in_stack_fffffffffffffff0;
  
  std_msgs::Header_<std::allocator<void>_>::Header_(in_stack_fffffffffffffff0);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  std::__cxx11::string::string((string *)(in_RDI + 0x58));
  std::__cxx11::string::string((string *)(in_RDI + 0x78));
  std::__cxx11::string::string((string *)(in_RDI + 0x98));
  *(undefined4 *)(in_RDI + 0xb8) = 0;
  memset((void *)(in_RDI + 0xc0),0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x4a0a22);
  return;
}

Assistant:

Log_()
    : header()
    , level(0)
    , name()
    , msg()
    , file()
    , function()
    , line(0)
    , topics()  {
    }